

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_operator.cpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformUnaryOperator
          (Transformer *this,string *op,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *child)

{
  pointer pFVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> in_RDI;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *in_stack_00000020;
  templated_unique_single_t result;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  value_type *in_stack_ffffffffffffff88;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_00;
  
  this_00._M_head_impl =
       (ParsedExpression *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
            *)0x1a18689);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::push_back((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)this_00._M_head_impl,in_stack_ffffffffffffff88);
  make_uniq<duckdb::FunctionExpression,std::__cxx11::string_const&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             result.
             super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
             .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl,
             in_stack_00000020);
  pFVar1 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)this_00._M_head_impl);
  pFVar1->is_operator = true;
  unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
  unique_ptr<duckdb::FunctionExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
            ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)this_00._M_head_impl,
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              *)pFVar1);
  unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
               *)0x1a186e4);
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             *)0x1a186ee);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformUnaryOperator(const string &op, unique_ptr<ParsedExpression> child) {
	vector<unique_ptr<ParsedExpression>> children;
	children.push_back(std::move(child));

	// built-in operator function
	auto result = make_uniq<FunctionExpression>(op, std::move(children));
	result->is_operator = true;
	return std::move(result);
}